

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QShaderDescription::InOutVariable*,long_long>
               (InOutVariable *first,longlong n,InOutVariable *d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int *piVar5;
  Data *pDVar6;
  BlockVariable *pBVar7;
  InOutVariable *pIVar8;
  QArrayDataPointer<QShaderDescription::BlockVariable> *pQVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ImageFlags IVar13;
  QArrayDataPointer<QShaderDescription::BlockVariable> *this;
  InOutVariable *pIVar14;
  InOutVariable *pIVar15;
  InOutVariable *pIVar16;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  pIVar14 = d_first + n;
  pIVar16 = first;
  pIVar8 = pIVar14;
  if (first < pIVar14) {
    pIVar16 = pIVar14;
    pIVar8 = first;
  }
  pIVar15 = d_first;
  if (pIVar8 != d_first) {
    do {
      pDVar1 = (first->name).d.d;
      (first->name).d.d = (Data *)0x0;
      (pIVar15->name).d.d = pDVar1;
      pcVar2 = (first->name).d.ptr;
      (first->name).d.ptr = (char *)0x0;
      (pIVar15->name).d.ptr = pcVar2;
      qVar3 = (first->name).d.size;
      (first->name).d.size = 0;
      (pIVar15->name).d.size = qVar3;
      iVar10 = first->location;
      iVar11 = first->binding;
      iVar12 = first->descriptorSet;
      pIVar15->type = first->type;
      pIVar15->location = iVar10;
      pIVar15->binding = iVar11;
      pIVar15->descriptorSet = iVar12;
      IVar13.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
      super_QFlagsStorage<QShaderDescription::ImageFlag>.i =
           (first->imageFlags).super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>;
      pIVar15->imageFormat = first->imageFormat;
      pIVar15->imageFlags =
           (ImageFlags)
           IVar13.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
           super_QFlagsStorage<QShaderDescription::ImageFlag>.i;
      pDVar4 = (first->arrayDims).d.d;
      (first->arrayDims).d.d = (Data *)0x0;
      (pIVar15->arrayDims).d.d = pDVar4;
      piVar5 = (first->arrayDims).d.ptr;
      (first->arrayDims).d.ptr = (int *)0x0;
      (pIVar15->arrayDims).d.ptr = piVar5;
      qVar3 = (first->arrayDims).d.size;
      (first->arrayDims).d.size = 0;
      (pIVar15->arrayDims).d.size = qVar3;
      pIVar15->perPatch = first->perPatch;
      pDVar6 = (first->structMembers).d.d;
      (first->structMembers).d.d = (Data *)0x0;
      (pIVar15->structMembers).d.d = pDVar6;
      pBVar7 = (first->structMembers).d.ptr;
      (first->structMembers).d.ptr = (BlockVariable *)0x0;
      (pIVar15->structMembers).d.ptr = pBVar7;
      qVar3 = (first->structMembers).d.size;
      (first->structMembers).d.size = 0;
      (pIVar15->structMembers).d.size = qVar3;
      pIVar15 = pIVar15 + 1;
      first = first + 1;
    } while (pIVar15 != pIVar8);
  }
  local_48.end = d_first;
  local_48.intermediate = pIVar15;
  for (; pIVar15 != pIVar14; pIVar15 = pIVar15 + 1) {
    pDVar1 = (pIVar15->name).d.d;
    (pIVar15->name).d.d = (first->name).d.d;
    (first->name).d.d = pDVar1;
    pcVar2 = (pIVar15->name).d.ptr;
    (pIVar15->name).d.ptr = (first->name).d.ptr;
    (first->name).d.ptr = pcVar2;
    qVar3 = (pIVar15->name).d.size;
    (pIVar15->name).d.size = (first->name).d.size;
    (first->name).d.size = qVar3;
    IVar13.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
    super_QFlagsStorage<QShaderDescription::ImageFlag>.i =
         (first->imageFlags).super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>;
    pIVar15->imageFormat = first->imageFormat;
    pIVar15->imageFlags =
         (ImageFlags)
         IVar13.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
         super_QFlagsStorage<QShaderDescription::ImageFlag>.i;
    iVar10 = first->location;
    iVar11 = first->binding;
    iVar12 = first->descriptorSet;
    pIVar15->type = first->type;
    pIVar15->location = iVar10;
    pIVar15->binding = iVar11;
    pIVar15->descriptorSet = iVar12;
    QArrayDataPointer<int>::operator=(&(pIVar15->arrayDims).d,&(first->arrayDims).d);
    pIVar15->perPatch = first->perPatch;
    QArrayDataPointer<QShaderDescription::BlockVariable>::operator=
              (&(pIVar15->structMembers).d,&(first->structMembers).d);
    first = first + 1;
  }
  local_48.iter = &local_48.end;
  if (first != pIVar16) {
    this = &first[-1].structMembers.d;
    do {
      QArrayDataPointer<QShaderDescription::BlockVariable>::~QArrayDataPointer(this);
      piVar5 = (int *)this[-2].size;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)this[-2].size,4,0x10);
        }
      }
      piVar5 = (int *)this[-4].size;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)this[-4].size,1,0x10);
        }
      }
      pQVar9 = this + -4;
      this = (QArrayDataPointer<QShaderDescription::BlockVariable> *)&this[-5].size;
    } while ((InOutVariable *)&pQVar9->size != pIVar16);
  }
  q_relocate_overlap_n_left_move<QShaderDescription::InOutVariable_*,_long_long>::Destructor::
  ~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}